

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.h
# Opt level: O2

void __thiscall
ZXing::Pdf417::BarcodeRow::getScaledRow
          (BarcodeRow *this,int scale,vector<bool,_std::allocator<bool>_> *output)

{
  const_reference cVar1;
  ulong *puVar2;
  ulong uVar3;
  size_t i;
  ulong __n;
  reference rVar4;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            (output,((ulong)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) *
                    (long)scale,false);
  for (__n = 0; __n < (ulong)(output->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(output->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(output->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->_row,__n / (ulong)(long)scale);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](output,__n);
    puVar2 = rVar4._M_p;
    if (cVar1) {
      uVar3 = rVar4._M_mask | *puVar2;
    }
    else {
      uVar3 = ~rVar4._M_mask & *puVar2;
    }
    *puVar2 = uVar3;
  }
  return;
}

Assistant:

void getScaledRow(int scale, std::vector<bool>& output) const {
		output.resize(_row.size() * scale);
		for (size_t i = 0; i < output.size(); ++i) {
			output[i] = _row[i / scale];
		}
	}